

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::free
          (Allocator<mecab_node_t,_mecab_path_t> *this,void *__ptr)

{
  FreeList<mecab_node_t> *this_00;
  FreeList<mecab_path_t> *pFVar1;
  ChunkFreeList<char> *pCVar2;
  
  this->id_ = 0;
  this_00 = scoped_ptr<MeCab::FreeList<mecab_node_t>_>::operator->(&this->node_freelist_);
  FreeList<mecab_node_t>::free(this_00,__ptr);
  pFVar1 = scoped_ptr<MeCab::FreeList<mecab_path_t>_>::get(&this->path_freelist_);
  if (pFVar1 != (FreeList<mecab_path_t> *)0x0) {
    pFVar1 = scoped_ptr<MeCab::FreeList<mecab_path_t>_>::operator->(&this->path_freelist_);
    FreeList<mecab_path_t>::free(pFVar1,__ptr);
  }
  pCVar2 = scoped_ptr<MeCab::ChunkFreeList<char>_>::get(&this->char_freelist_);
  if (pCVar2 != (ChunkFreeList<char> *)0x0) {
    pCVar2 = scoped_ptr<MeCab::ChunkFreeList<char>_>::operator->(&this->char_freelist_);
    ChunkFreeList<char>::free(pCVar2,__ptr);
  }
  return;
}

Assistant:

void free() {
    id_ = 0;
    node_freelist_->free();
    if (path_freelist_.get()) {
      path_freelist_->free();
    }
    if (char_freelist_.get()) {
      char_freelist_->free();
    }
  }